

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

void __thiscall
soplex::Array<soplex::SPxPricer<double>::IdxElement>::Array
          (Array<soplex::SPxPricer<double>::IdxElement> *this,int n)

{
  (this->data).
  super__Vector_base<soplex::SPxPricer<double>::IdxElement,_std::allocator<soplex::SPxPricer<double>::IdxElement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->data).
  super__Vector_base<soplex::SPxPricer<double>::IdxElement,_std::allocator<soplex::SPxPricer<double>::IdxElement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->data).
  super__Vector_base<soplex::SPxPricer<double>::IdxElement,_std::allocator<soplex::SPxPricer<double>::IdxElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<soplex::SPxPricer<double>::IdxElement,_std::allocator<soplex::SPxPricer<double>::IdxElement>_>
  ::resize(&this->data,(long)n);
  return;
}

Assistant:

explicit
   Array(int n = 0)
   {
      data.resize(n);
   }